

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void arm::display_shift(ostream *o,RegisterShiftKind shift)

{
  undefined1 in_SIL;
  ostream *in_RDI;
  
  switch(in_SIL) {
  case 0:
    std::operator<<(in_RDI,"ASR");
    break;
  case 1:
    std::operator<<(in_RDI,"LSL");
    break;
  case 2:
    std::operator<<(in_RDI,"LSR");
    break;
  case 3:
    std::operator<<(in_RDI,"ROR");
    break;
  case 4:
    std::operator<<(in_RDI,"RRX");
  }
  return;
}

Assistant:

void display_shift(std::ostream &o, RegisterShiftKind shift) {
  switch (shift) {
    case RegisterShiftKind::Lsl:
      o << "LSL";
      break;
    case RegisterShiftKind::Lsr:
      o << "LSR";
      break;
    case RegisterShiftKind::Asr:
      o << "ASR";
      break;
    case RegisterShiftKind::Ror:
      o << "ROR";
      break;
    case RegisterShiftKind::Rrx:
      o << "RRX";
      break;
  }
}